

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<void(S::*const&)()>::operator==
          (result *__return_storage_ptr__,expression_lhs<void(S::*const&)()> *this,
          offset_in_S_to_subr *rhs)

{
  lest *this_00;
  offset_in_S_to_subr oVar1;
  offset_in_S_to_subr oVar2;
  offset_in_S_to_subr oVar3;
  offset_in_S_to_subr oVar4;
  offset_in_S_to_subr *in_R8;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  this_00 = *(lest **)this;
  oVar1 = *(offset_in_S_to_subr *)this_00;
  oVar2 = *(offset_in_S_to_subr *)(this_00 + 8);
  oVar3 = *rhs;
  oVar4 = rhs[1];
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"==","");
  to_string<void(S::*)(),void(S::*)()>
            (&local_50,this_00,(offset_in_S_to_subr *)local_70,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (oVar2 == oVar4 || oVar1 == 0) && oVar1 == oVar3;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result{ lhs != rhs, to_string( lhs, "!=", rhs ) }; }